

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPool.cpp
# Opt level: O1

void __thiscall psy::C::MemoryPool::~MemoryPool(MemoryPool *this)

{
  long lVar1;
  
  if (this->blocks_ != (char **)0x0) {
    if (0 < this->allocatedBlocks_) {
      lVar1 = 0;
      do {
        if (this->blocks_[lVar1] != (char *)0x0) {
          free(this->blocks_[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < this->allocatedBlocks_);
    }
    free(this->blocks_);
    return;
  }
  return;
}

Assistant:

MemoryPool::~MemoryPool()
{
    if (blocks_) {
        for (int i = 0; i < allocatedBlocks_; ++i) {
            if (char* b = blocks_[i])
                std::free(b);
        }
        std::free(blocks_);
    }
}